

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_7d8c0a::UserArgumentParser::UserArgumentParser(UserArgumentParser *this)

{
  UserArgumentParser *this_local;
  
  cmArgumentParser<void>::cmArgumentParser(&this->super_cmArgumentParser<void>);
  return;
}

Assistant:

void Bind(std::vector<std::string> const& names,
            std::map<std::string, T>& ref, H duplicateKey)
  {
    for (std::string const& key : names) {
      auto const it = ref.emplace(key, T{}).first;
      bool const inserted = this->cmArgumentParser<void>::Bind(
        cm::string_view(it->first), it->second);
      if (!inserted) {
        duplicateKey(key);
      }
    }
  }